

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ptexture.h
# Opt level: O3

void Ptex::v2_4::(anonymous_namespace)::Apply<float,3>
               (PtexSeparableKernel *k,float *result,void *data,int param_4,int param_5)

{
  undefined8 *puVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  int iVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  bVar3 = (k->res).ulog2;
  iVar8 = 3 << (bVar3 & 0x1f);
  if (k->vw != 0) {
    puVar10 = (undefined8 *)((long)data + ((long)(k->v << (bVar3 & 0x1f)) + (long)k->u) * 0xc);
    puVar1 = (undefined8 *)((long)puVar10 + (long)(k->vw * iVar8) * 4);
    pfVar7 = k->kv;
    iVar4 = k->uw;
    pfVar5 = k->ku;
    do {
      fVar12 = *pfVar5;
      fVar13 = fVar12 * (float)*puVar10;
      fVar14 = fVar12 * (float)((ulong)*puVar10 >> 0x20);
      fVar12 = fVar12 * *(float *)(puVar10 + 1);
      puVar9 = puVar10;
      lVar11 = (long)(iVar4 * 3) * 4 + -0xc;
      pfVar6 = pfVar5;
      if (iVar4 != 1) {
        do {
          puVar10 = (undefined8 *)((long)puVar9 + 0xc);
          fVar2 = pfVar6[1];
          fVar13 = fVar13 + fVar2 * (float)*(undefined8 *)((long)puVar9 + 0xc);
          fVar14 = fVar14 + fVar2 * (float)((ulong)*(undefined8 *)((long)puVar9 + 0xc) >> 0x20);
          fVar12 = fVar12 + fVar2 * *(float *)((long)puVar9 + 0x14);
          lVar11 = lVar11 + -0xc;
          puVar9 = puVar10;
          pfVar6 = pfVar6 + 1;
        } while (lVar11 != 0);
      }
      fVar2 = *pfVar7;
      *(ulong *)result =
           CONCAT44(fVar2 * fVar14 + (float)((ulong)*(undefined8 *)result >> 0x20),
                    fVar2 * fVar13 + (float)*(undefined8 *)result);
      pfVar7 = pfVar7 + 1;
      result[2] = fVar12 * fVar2 + result[2];
      puVar10 = (undefined8 *)((long)puVar10 + (long)(iVar8 + iVar4 * -3) * 4 + 0xc);
    } while (puVar10 != puVar1);
  }
  return;
}

Assistant:

int u() const { return 1<<(unsigned)ulog2; }